

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transcode_utils.h
# Opt level: O0

void __thiscall
ktx::OptionsTranscodeTarget<false>::validateTextureTranscode
          (OptionsTranscodeTarget<false> *this,KTXTexture2 *texture,Reporter *report)

{
  bool bVar1;
  ktx_transcode_fmt_e *in_RDI;
  TranscodeSwizzleInfo tswizzle;
  Reporter *in_stack_000000d0;
  KTXTexture2 *in_stack_000000d8;
  optional<ktx_transcode_fmt_e> *in_stack_ffffffffffffffa0;
  undefined8 local_48;
  ktx_transcode_fmt_e local_40;
  string local_38 [56];
  
  determineTranscodeSwizzle(in_stack_000000d8,in_stack_000000d0);
  bVar1 = std::optional<ktx_transcode_fmt_e>::has_value((optional<ktx_transcode_fmt_e> *)0x28a0b9);
  if (!bVar1) {
    std::optional<ktx_transcode_fmt_e>::optional<ktx_transcode_fmt_e,_true>
              (in_stack_ffffffffffffffa0,in_RDI);
    *(undefined8 *)in_RDI = local_48;
    std::__cxx11::string::operator=((string *)(in_RDI + 2),"rgba8");
    in_RDI[10] = local_40;
  }
  std::__cxx11::string::operator=((string *)(in_RDI + 0xc),local_38);
  TranscodeSwizzleInfo::~TranscodeSwizzleInfo((TranscodeSwizzleInfo *)0x28a137);
  return;
}

Assistant:

void validateTextureTranscode(const KTXTexture2& texture, Reporter& report) {
        const auto tswizzle = determineTranscodeSwizzle(texture, report);

        if (!transcodeTarget.has_value()) {
            transcodeTarget = KTX_TTF_RGBA32;
            transcodeTargetName = "rgba8";
            transcodeSwizzleComponents = tswizzle.defaultNumComponents;
        }

        transcodeSwizzle = tswizzle.swizzle;
    }